

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

bool __thiscall
Parser::parseFunctionDeclaration
          (Parser *this,Identifier *name,vector<Identifier,_std::allocator<Identifier>_> *parameters
          )

{
  iterator iVar1;
  Token *pTVar2;
  
  pTVar2 = Tokenizer::peekToken
                     ((this->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
  if (pTVar2->type == Identifier) {
    pTVar2 = Tokenizer::nextToken
                       ((this->entries).
                        super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
    if (*(__index_type *)
         ((long)&(pTVar2->value).
                 super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
         + 0x20) != '\x04') {
LAB_00147886:
      __assert_fail("std::holds_alternative<Identifier>(value)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                    ,0x4d,"const Identifier &Token::identifierValue() const");
    }
    std::__cxx11::string::_M_assign((string *)name);
    pTVar2 = Tokenizer::nextToken
                       ((this->entries).
                        super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
    if (pTVar2->type == LParen) {
      std::vector<Identifier,_std::allocator<Identifier>_>::_M_erase_at_end
                (parameters,
                 (parameters->super__Vector_base<Identifier,_std::allocator<Identifier>_>)._M_impl.
                 super__Vector_impl_data._M_start);
      while ((iVar1._M_node =
                   (_List_node_base *)
                   (this->entries).
                   super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl
                   .super__Vector_impl_data._M_finish[-1].tokenizer,
             (_List_node_base *)((TokenizerPosition *)((long)(iVar1._M_node + 1) + 8))->it !=
             iVar1._M_node &&
             (pTVar2 = Tokenizer::peekToken((Tokenizer *)iVar1._M_node,0), pTVar2->type != RParen)))
      {
        if (((parameters->super__Vector_base<Identifier,_std::allocator<Identifier>_>)._M_impl.
             super__Vector_impl_data._M_start !=
             (parameters->super__Vector_base<Identifier,_std::allocator<Identifier>_>)._M_impl.
             super__Vector_impl_data._M_finish) &&
           (pTVar2 = Tokenizer::peekToken
                               ((this->entries).
                                super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>
                                ._M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0),
           pTVar2->type == Comma)) {
          Tokenizer::eatTokens
                    ((this->entries).
                     super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                     _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,1);
        }
        pTVar2 = Tokenizer::nextToken
                           ((this->entries).
                            super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
        if (pTVar2->type != Identifier) {
          return false;
        }
        if (*(__index_type *)
             ((long)&(pTVar2->value).
                     super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                     super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     .
                     super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     .
                     super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     .
                     super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     .
                     super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
             + 0x20) != '\x04') goto LAB_00147886;
        std::vector<Identifier,std::allocator<Identifier>>::emplace_back<Identifier_const&>
                  ((vector<Identifier,std::allocator<Identifier>> *)parameters,
                   (Identifier *)&pTVar2->value);
      }
      iVar1._M_node =
           (_List_node_base *)
           (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].tokenizer;
      if ((_List_node_base *)((TokenizerPosition *)((long)(iVar1._M_node + 1) + 8))->it !=
          iVar1._M_node) {
        pTVar2 = Tokenizer::nextToken((Tokenizer *)iVar1._M_node);
        return pTVar2->type == RParen;
      }
    }
  }
  return false;
}

Assistant:

bool Parser::parseFunctionDeclaration(Identifier& name, std::vector<Identifier> &parameters)
{
	const Token& first = peekToken();
	if (first.type != TokenType::Identifier)
		return false;

	name = nextToken().identifierValue();

	if (nextToken().type != TokenType::LParen)
		return false;

	parameters.clear();
	while (!atEnd() && peekToken().type != TokenType::RParen)
	{
		if (!parameters.empty() && peekToken().type == TokenType::Comma)
			eatToken();

		const Token& token = nextToken();
		if (token.type != TokenType::Identifier)
			return false;

		parameters.emplace_back(token.identifierValue());
	}

	return !atEnd() && nextToken().type == TokenType::RParen;
}